

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> __thiscall
helics::make_cloning_filter
          (helics *this,FilterTypes type,Core *core,string_view delivery,string_view name)

{
  Core *extraout_RDX;
  Core *local_28;
  
  local_28 = core;
  std::
  make_unique<helics::CloningFilter,helics::Core*&,std::basic_string_view<char,std::char_traits<char>>&>
            ((Core **)this,(basic_string_view<char,_std::char_traits<char>_> *)&local_28);
  addOperations(*(Filter **)this,type,extraout_RDX);
  if (delivery._M_len != 0) {
    CloningFilter::addDeliveryEndpoint(*(CloningFilter **)this,delivery);
  }
  return (__uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
          )(__uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CloningFilter> make_cloning_filter(FilterTypes type,
                                                   Core* core,
                                                   std::string_view delivery,
                                                   std::string_view name)

{
    auto dfilt = std::make_unique<CloningFilter>(core, name);
    addOperations(dfilt.get(), type, core);
    if (!delivery.empty()) {
        dfilt->addDeliveryEndpoint(delivery);
    }
    return dfilt;
}